

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,Privkey *privkey,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list,ByteData *finterprint)

{
  Privkey *in_stack_ffffffffffffff78;
  Privkey *in_stack_ffffffffffffff80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  Pubkey local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd0;
  ByteData *finterprint_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list_local;
  Privkey *privkey_local;
  KeyData *this_local;
  
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  this_00 = &this->path_;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  ByteData::ByteData((ByteData *)this_00,&this->fingerprint_);
  Privkey::GetPubkey(&local_50,privkey);
  Pubkey::operator=(&this->pubkey_,&local_50);
  Pubkey::~Pubkey((Pubkey *)0x44acd8);
  return;
}

Assistant:

KeyData::KeyData(
    const Privkey& privkey, const std::vector<uint32_t>& child_num_list,
    const ByteData& finterprint)
    : privkey_(privkey), path_(child_num_list), fingerprint_(finterprint) {
  pubkey_ = privkey.GetPubkey();
}